

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O0

void i18n_text_cb(Fl_Input *i,void *param_2)

{
  void *param_1_local;
  Fl_Input *i_local;
  
  undo_checkpoint();
  if (i == i18n_function_input) {
    i18n_function = Fl_Input_::value(&i->super_Fl_Input_);
  }
  else if (i == i18n_file_input) {
    i18n_file = Fl_Input_::value(&i->super_Fl_Input_);
  }
  else if (i == i18n_include_input) {
    i18n_include = Fl_Input_::value(&i->super_Fl_Input_);
  }
  set_modflag(1);
  return;
}

Assistant:

void i18n_text_cb(Fl_Input *i, void *) {
  undo_checkpoint();
  
  if (i == i18n_function_input)
    i18n_function = i->value();
  else if (i == i18n_file_input)
    i18n_file = i->value();
  else if (i == i18n_include_input)
    i18n_include = i->value();
  
  set_modflag(1);
}